

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

Cnf_Dat_t * Cnf_DeriveGiaRemapped(Gia_Man_t *p)

{
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar1;
  
  pAig = Gia_ManToAigSimple(p);
  pAig->nRegs = 0;
  pCVar1 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  return pCVar1;
}

Assistant:

static inline Cnf_Dat_t * Cnf_DeriveGiaRemapped( Gia_Man_t * p )
{
    Cnf_Dat_t * pCnf;
    Aig_Man_t * pAig = Gia_ManToAigSimple( p );
    pAig->nRegs = 0;
    pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    Aig_ManStop( pAig );
    return pCnf;
//    return Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
}